

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init_if_sw.cpp
# Opt level: O3

int main(void)

{
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nBasic Example of if initializer.",0x21);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Basic Example of switch-case initializer.\n",0x2a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  return 0;
}

Assistant:

int main() {

	//if(init; cond)
	if (int x =9; x<9.000000001) 
		std::cout << "\nBasic Example of if initializer." << std::endl;
	//switch(init; cond)
	switch (long long y [] = {2198376, 7636847}; y[0] +1) {
		case 7637847:
			break;
		case 2198377:
			std::cout << "Basic Example of switch-case initializer.\n" << std::endl;
			break;
	}
	return 0;
}